

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

void FileMappingCleanupRoutine
               (CPalThread *pThread,IPalObject *pObjectToCleanup,bool fShutdown,
               bool fCleanupSharedState)

{
  int iVar1;
  undefined7 in_register_00000009;
  char *__format;
  char *local_38;
  CFileMappingImmutableData *pImmutableData;
  IDataLock *pLocalDataLock;
  CFileMappingProcessLocalData *pLocalData;
  
  local_38 = (char *)0x0;
  pLocalDataLock = (IDataLock *)0x0;
  pImmutableData = (CFileMappingImmutableData *)0x0;
  if ((int)CONCAT71(in_register_00000009,fCleanupSharedState) != 0) {
    iVar1 = (*pObjectToCleanup->_vptr_IPalObject[2])(pObjectToCleanup,&local_38);
    if (iVar1 != 0) {
      fprintf(_stderr,"] %s %s:%d","FileMappingCleanupRoutine",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
              ,0xab);
      __format = "Unable to obtain immutable data for object to be reclaimed";
      goto LAB_00333c53;
    }
    if (*(int *)(local_38 + 0x1008) != 0) {
      unlink(local_38);
    }
  }
  if (fShutdown) {
    return;
  }
  iVar1 = (*pObjectToCleanup->_vptr_IPalObject[3])
                    (pObjectToCleanup,pThread,1,&pImmutableData,&pLocalDataLock);
  if (iVar1 == 0) {
    iVar1 = *(int *)&pLocalDataLock->_vptr_IDataLock;
    if (iVar1 != -1) {
      close(iVar1);
      *(undefined4 *)&pLocalDataLock->_vptr_IDataLock = 0xffffffff;
    }
    (*(code *)**(undefined8 **)pImmutableData->szFileName)(pImmutableData,pThread,iVar1 != -1);
    return;
  }
  fprintf(_stderr,"] %s %s:%d","FileMappingCleanupRoutine",
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
          ,0xc5);
  __format = "Unable to obtain process local data for object to be reclaimed";
LAB_00333c53:
  fprintf(_stderr,__format);
  return;
}

Assistant:

void
FileMappingCleanupRoutine(
    CPalThread *pThread,
    IPalObject *pObjectToCleanup,
    bool fShutdown,
    bool fCleanupSharedState
    )
{
    PAL_ERROR palError = NO_ERROR;
    CFileMappingImmutableData *pImmutableData = NULL;
    CFileMappingProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;
    bool fDataChanged = FALSE;

    if (TRUE == fCleanupSharedState)
    {
        //
        // If we created a temporary file to back this mapping we need
        // to unlink it now
        //
        
        palError = pObjectToCleanup->GetImmutableData(
            reinterpret_cast<void**>(&pImmutableData)
            );

        if (NO_ERROR != palError)
        {
            ASSERT("Unable to obtain immutable data for object to be reclaimed");
            return;
        }

        if (pImmutableData->bPALCreatedTempFile)
        {
            unlink(pImmutableData->szFileName);
        }
    }

    if (FALSE == fShutdown)
    {
        //
        // We only need to close the object's descriptor if we're not
        // shutting down
        //
        
        palError = pObjectToCleanup->GetProcessLocalData(
            pThread,
            WriteLock,
            &pLocalDataLock,
            reinterpret_cast<void**>(&pLocalData)
            );

        if (NO_ERROR != palError)
        {
            ASSERT("Unable to obtain process local data for object to be reclaimed");
            return;
        }

        if (-1 != pLocalData->UnixFd)
        {
            close(pLocalData->UnixFd);
            pLocalData->UnixFd = -1;
            fDataChanged = TRUE;
        }

        pLocalDataLock->ReleaseLock(pThread, fDataChanged);
    }

    //
    // Why don't we need to deal with any views that may have been created
    // from this mapping? If the process is shutting down then there's nothing
    // that we need to take care of, as the OS will remove the underlying
    // mappings when the process goes away. If we're not shutting down then
    // there's no way for a view to exist against this mapping, since each
    // view holds a reference against the mapping object.
    //
}